

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O3

compile_errcode __thiscall ConstantDeclaration::Generate(ConstantDeclaration *this)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  SymbolName SVar3;
  
  SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
  if (SVar1 == CONST_SYM) {
    do {
      cVar2 = ConstantDefinition::Generate(&this->m_constant_definition);
      if (cVar2 != 0) {
        return -1;
      }
      SVar3 = SymbolQueue::GetCurrentName(handle_correct_queue);
    } while (SVar3 == CONST_SYM);
  }
  return -(uint)(SVar1 != CONST_SYM);
}

Assistant:

compile_errcode ConstantDeclaration::Generate() {
    int ret = 0;
    int correct_count = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        if (name == CONST_SYM) {
            if ((ret = m_constant_definition.Generate()) == COMPILE_OK) {
                correct_count++;
            } else {
                return NOT_MATCH;
            }
        } else {
            if (correct_count > 0)
                return COMPILE_OK;
            else
                return NOT_MATCH;
        }
    }
}